

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

planck_unit_suite_t * cpp_wrapper2_getsuite_3(void)

{
  planck_unit_suite_t *suite;
  
  suite = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_update_empty_single_all,
             "test_cpp_wrapper_update_empty_single_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_update_nonexist_single_all,
             "test_cpp_wrapper_update_nonexist_single_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_update_nonexist_in_many_all,
             "test_cpp_wrapper_update_nonexist_in_many_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_update_exist_single_all,
             "test_cpp_wrapper_update_exist_single_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_cpp_wrapper_update_exist_in_many_all,
             "test_cpp_wrapper_update_exist_in_many_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  return suite;
}

Assistant:

planck_unit_suite_t *
cpp_wrapper2_getsuite_3(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_update_empty_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_update_nonexist_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_update_nonexist_in_many_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_update_exist_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_update_exist_in_many_all);

	return suite;
}